

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

string * __thiscall
t_json_generator::get_qualified_name_abi_cxx11_
          (string *__return_storage_ptr__,t_json_generator *this,t_type *ttype)

{
  int iVar1;
  t_program *ptVar2;
  undefined4 extraout_var;
  string *__lhs;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  t_type *local_20;
  t_type *ttype_local;
  t_json_generator *this_local;
  
  local_20 = ttype;
  ttype_local = (t_type *)this;
  this_local = (t_json_generator *)__return_storage_ptr__;
  if (((this->should_merge_includes_ & 1U) == 0) &&
     (ptVar2 = t_type::get_program(ttype), ptVar2 != (this->super_t_generator).program_)) {
    ptVar2 = t_type::get_program(local_20);
    __lhs = t_program::get_name_abi_cxx11_(ptVar2);
    std::operator+(&local_40,__lhs,".");
    iVar1 = (*(local_20->super_t_doc)._vptr_t_doc[3])();
    std::operator+(__return_storage_ptr__,&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar1));
    std::__cxx11::string::~string((string *)&local_40);
    return __return_storage_ptr__;
  }
  iVar1 = (*(local_20->super_t_doc)._vptr_t_doc[3])();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var,iVar1));
  return __return_storage_ptr__;
}

Assistant:

string t_json_generator::get_qualified_name(t_type* ttype) {
  if (should_merge_includes_ || ttype->get_program() == program_) {
    return ttype->get_name();
  }
  return ttype->get_program()->get_name() + "." + ttype->get_name();
}